

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorCommon.cxx
# Opt level: O0

string * cmQtAutoGeneratorCommon::Quoted(string *__return_storage_ptr__,string *text)

{
  char **ppcVar1;
  char **ppcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char **local_28;
  char **it;
  string *local_18;
  string *text_local;
  string *res;
  
  it._7_1_ = 0;
  local_18 = text;
  text_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)text);
  for (local_28 = cmArrayBegin<char_const*,18ul>(&Quoted::rep); ppcVar1 = local_28,
      ppcVar2 = cmArrayEnd<char_const*,18ul>(&Quoted::rep), ppcVar1 != ppcVar2;
      local_28 = local_28 + 2) {
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,*local_28,local_28[1]);
  }
  std::operator+(&local_58,'\"',__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGeneratorCommon::Quoted(const std::string& text)
{
  static const char* rep[18] = { "\\", "\\\\", "\"", "\\\"", "\a", "\\a",
                                 "\b", "\\b",  "\f", "\\f",  "\n", "\\n",
                                 "\r", "\\r",  "\t", "\\t",  "\v", "\\v" };

  std::string res = text;
  for (const char* const* it = cmArrayBegin(rep); it != cmArrayEnd(rep);
       it += 2) {
    cmSystemTools::ReplaceString(res, *it, *(it + 1));
  }
  res = '"' + res;
  res += '"';
  return res;
}